

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::DoesFileExistWithExtensions
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *headerExts)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  string *headerExt;
  string hname;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  pbVar1 = (headerExts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (headerExts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    if (pbVar4 == pbVar1) break;
    std::__cxx11::string::_M_assign((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((string *)&local_48);
    bVar3 = cmsys::SystemTools::FileExists(&local_48);
    pbVar2 = pbVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::~string((string *)&local_48);
  return pbVar4 != pbVar1;
}

Assistant:

bool cmSystemTools::DoesFileExistWithExtensions(
  const std::string& name, const std::vector<std::string>& headerExts)
{
  std::string hname;

  for (std::string const& headerExt : headerExts) {
    hname = name;
    hname += ".";
    hname += headerExt;
    if (cmSystemTools::FileExists(hname)) {
      return true;
    }
  }
  return false;
}